

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.cpp
# Opt level: O3

int duckdb::Linenoise::ParseOption(char **azArg,int nArg,char **out_error)

{
  char cVar1;
  char *__s1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  HighlightingType type;
  
  pcVar4 = *azArg;
  iVar2 = strcmp(pcVar4,"highlight");
  if (iVar2 == 0) {
    if (nArg != 2) goto LAB_00213a65;
    pcVar4 = azArg[1];
    iVar2 = strcmp(pcVar4,"off");
    if (iVar2 == 0) {
LAB_00213907:
      Highlighting::Disable();
      return 1;
    }
    cVar1 = *pcVar4;
    if (cVar1 == 'o') {
      if (pcVar4[1] == 'n') {
        cVar1 = pcVar4[2];
        goto joined_r0x00213a63;
      }
    }
    else if (cVar1 == '1') {
      cVar1 = pcVar4[1];
joined_r0x00213a63:
      if (cVar1 == '\0') {
        Highlighting::Enable();
        return 1;
      }
    }
    else if ((cVar1 == '0') && (pcVar4[1] == '\0')) goto LAB_00213907;
LAB_00213a65:
    pcVar4 = "Expected usage: .highlight [off|on]";
    goto LAB_00213abe;
  }
  iVar2 = strcmp(pcVar4,"render_errors");
  if (iVar2 == 0) {
    if (nArg != 2) goto LAB_00213a89;
    pcVar4 = azArg[1];
    iVar2 = strcmp(pcVar4,"off");
    if (iVar2 == 0) {
LAB_0021395b:
      DisableErrorRendering();
      return 1;
    }
    cVar1 = *pcVar4;
    if (cVar1 == 'o') {
      if (pcVar4[1] == 'n') {
        cVar1 = pcVar4[2];
        goto joined_r0x00213a87;
      }
    }
    else if (cVar1 == '1') {
      cVar1 = pcVar4[1];
joined_r0x00213a87:
      if (cVar1 == '\0') {
        EnableErrorRendering();
        return 1;
      }
    }
    else if ((cVar1 == '0') && (pcVar4[1] == '\0')) goto LAB_0021395b;
LAB_00213a89:
    pcVar4 = "Expected usage: .render_errors [off|on]";
    goto LAB_00213abe;
  }
  iVar2 = strcmp(pcVar4,"render_completion");
  if (iVar2 == 0) {
    if (nArg != 2) goto LAB_00213ab7;
    pcVar4 = azArg[1];
    iVar2 = strcmp(pcVar4,"off");
    if (iVar2 == 0) {
LAB_00213a47:
      DisableCompletionRendering();
      return 1;
    }
    cVar1 = *pcVar4;
    if (cVar1 == 'o') {
      if (pcVar4[1] == 'n') {
        cVar1 = pcVar4[2];
        goto joined_r0x00213ab5;
      }
    }
    else if (cVar1 == '1') {
      cVar1 = pcVar4[1];
joined_r0x00213ab5:
      if (cVar1 == '\0') {
        EnableCompletionRendering();
        return 1;
      }
    }
    else if ((cVar1 == '0') && (pcVar4[1] == '\0')) goto LAB_00213a47;
LAB_00213ab7:
    pcVar4 = "Expected usage: .render_completion [off|on]";
    goto LAB_00213abe;
  }
  iVar2 = strcmp(pcVar4,"keyword");
  if ((((iVar2 == 0) || (iVar2 = strcmp(pcVar4,"constant"), iVar2 == 0)) ||
      (iVar2 = strcmp(pcVar4,"comment"), iVar2 == 0)) ||
     (((iVar2 = strcmp(pcVar4,"error"), iVar2 == 0 || (iVar2 = strcmp(pcVar4,"cont"), iVar2 == 0))
      || (iVar2 = strcmp(pcVar4,"cont_sel"), iVar2 == 0)))) {
    if ((nArg == 2) && (pcVar4 = Highlighting::GetColorOption(azArg[1]), pcVar4 != (char *)0x0)) {
      __s1 = *azArg;
      iVar2 = strcmp(__s1,"keyword");
      if (iVar2 == 0) {
        type = KEYWORD;
      }
      else {
        iVar2 = strcmp(__s1,"constant");
        if (iVar2 == 0) {
          type = CONSTANT;
        }
        else {
          iVar2 = strcmp(__s1,"comment");
          if (iVar2 == 0) {
            type = COMMENT;
          }
          else {
            iVar2 = strcmp(__s1,"error");
            if (iVar2 == 0) {
              type = ERROR;
            }
            else {
              iVar2 = strcmp(__s1,"cont");
              type = CONTINUATION_SELECTED - (iVar2 == 0);
            }
          }
        }
      }
      goto LAB_00213ae7;
    }
    pcVar4 = 
    "Expected usage: .[keyword|constant|comment|error|cont|cont_sel] [red|green|yellow|blue|magenta|cyan|white|brightblack|brightred|brightgreen|brightyellow|brightblue|brightmagenta|brightcyan|brightwhite]"
    ;
    goto LAB_00213abe;
  }
  iVar2 = strcmp(pcVar4,"keywordcode");
  if (iVar2 == 0) {
    type = KEYWORD;
LAB_00213b4a:
    if (nArg != 2) {
LAB_00213b55:
      pcVar4 = 
      "Expected usage: .[keywordcode|constantcode|commentcode|errorcode|contcode|cont_selcode] [terminal_code]"
      ;
LAB_00213abe:
      *out_error = pcVar4;
      return 1;
    }
  }
  else {
    iVar2 = strcmp(pcVar4,"constantcode");
    if (iVar2 == 0) {
      type = CONSTANT;
      goto LAB_00213b4a;
    }
    iVar3 = strcmp(pcVar4,"commentcode");
    if ((((iVar3 != 0) && (iVar3 = strcmp(pcVar4,"errorcode"), iVar3 != 0)) &&
        (iVar3 = strcmp(pcVar4,"contcode"), iVar3 != 0)) &&
       (iVar3 = strcmp(pcVar4,"cont_selcode"), iVar3 != 0)) {
      iVar2 = strcmp(pcVar4,"multiline");
      if (iVar2 == 0) {
        linenoiseSetMultiLine(1);
        return 1;
      }
      iVar2 = strcmp(pcVar4,"singleline");
      if (iVar2 == 0) {
        linenoiseSetMultiLine(0);
        return 1;
      }
      return 0;
    }
    if (nArg != 2) goto LAB_00213b55;
    if (iVar2 == 0) {
      type = CONSTANT;
    }
    else {
      iVar2 = strcmp(pcVar4,"commentcode");
      if (iVar2 == 0) {
        type = COMMENT;
      }
      else {
        iVar2 = strcmp(pcVar4,"errorcode");
        if (iVar2 == 0) {
          type = ERROR;
        }
        else {
          iVar2 = strcmp(pcVar4,"contcode");
          type = CONTINUATION_SELECTED - (iVar2 == 0);
        }
      }
    }
  }
  pcVar4 = azArg[1];
LAB_00213ae7:
  Highlighting::SetHighlightingColor(type,pcVar4);
  return 1;
}

Assistant:

int Linenoise::ParseOption(const char **azArg, int nArg, const char **out_error) {
	if (strcmp(azArg[0], "highlight") == 0) {
		if (nArg == 2) {
			if (strcmp(azArg[1], "off") == 0 || strcmp(azArg[1], "0") == 0) {
				Highlighting::Disable();
				return 1;
			} else if (strcmp(azArg[1], "on") == 0 || strcmp(azArg[1], "1") == 0) {
				Highlighting::Enable();
				return 1;
			}
		}
		*out_error = "Expected usage: .highlight [off|on]";
		return 1;
	} else if (strcmp(azArg[0], "render_errors") == 0) {
		if (nArg == 2) {
			if (strcmp(azArg[1], "off") == 0 || strcmp(azArg[1], "0") == 0) {
				Linenoise::DisableErrorRendering();
				return 1;
			} else if (strcmp(azArg[1], "on") == 0 || strcmp(azArg[1], "1") == 0) {
				Linenoise::EnableErrorRendering();
				return 1;
			}
		}
		*out_error = "Expected usage: .render_errors [off|on]";
		return 1;
	} else if (strcmp(azArg[0], "render_completion") == 0) {
		if (nArg == 2) {
			if (strcmp(azArg[1], "off") == 0 || strcmp(azArg[1], "0") == 0) {
				Linenoise::DisableCompletionRendering();
				return 1;
			} else if (strcmp(azArg[1], "on") == 0 || strcmp(azArg[1], "1") == 0) {
				Linenoise::EnableCompletionRendering();
				return 1;
			}
		}
		*out_error = "Expected usage: .render_completion [off|on]";
		return 1;
	} else if (strcmp(azArg[0], "keyword") == 0 || strcmp(azArg[0], "constant") == 0 ||
	           strcmp(azArg[0], "comment") == 0 || strcmp(azArg[0], "error") == 0 || strcmp(azArg[0], "cont") == 0 ||
	           strcmp(azArg[0], "cont_sel") == 0) {
		if (nArg == 2) {
			const char *option = Highlighting::GetColorOption(azArg[1]);
			if (option) {
				HighlightingType type;
				if (strcmp(azArg[0], "keyword") == 0) {
					type = HighlightingType::KEYWORD;
				} else if (strcmp(azArg[0], "constant") == 0) {
					type = HighlightingType::CONSTANT;
				} else if (strcmp(azArg[0], "comment") == 0) {
					type = HighlightingType::COMMENT;
				} else if (strcmp(azArg[0], "error") == 0) {
					type = HighlightingType::ERROR;
				} else if (strcmp(azArg[0], "cont") == 0) {
					type = HighlightingType::CONTINUATION;
				} else {
					type = HighlightingType::CONTINUATION_SELECTED;
				}
				Highlighting::SetHighlightingColor(type, option);
				return 1;
			}
		}
		*out_error = "Expected usage: .[keyword|constant|comment|error|cont|cont_sel] "
		             "[red|green|yellow|blue|magenta|cyan|white|brightblack|brightred|brightgreen|brightyellow|"
		             "brightblue|brightmagenta|brightcyan|brightwhite]";
		return 1;
	} else if (strcmp(azArg[0], "keywordcode") == 0 || strcmp(azArg[0], "constantcode") == 0 ||
	           strcmp(azArg[0], "commentcode") == 0 || strcmp(azArg[0], "errorcode") == 0 ||
	           strcmp(azArg[0], "contcode") == 0 || strcmp(azArg[0], "cont_selcode") == 0) {
		if (nArg == 2) {
			HighlightingType type;
			if (strcmp(azArg[0], "keywordcode") == 0) {
				type = HighlightingType::KEYWORD;
			} else if (strcmp(azArg[0], "constantcode") == 0) {
				type = HighlightingType::CONSTANT;
			} else if (strcmp(azArg[0], "commentcode") == 0) {
				type = HighlightingType::COMMENT;
			} else if (strcmp(azArg[0], "errorcode") == 0) {
				type = HighlightingType::ERROR;
			} else if (strcmp(azArg[0], "contcode") == 0) {
				type = HighlightingType::CONTINUATION;
			} else {
				type = HighlightingType::CONTINUATION_SELECTED;
			}
			Highlighting::SetHighlightingColor(type, azArg[1]);
			return 1;
		}
		*out_error =
		    "Expected usage: .[keywordcode|constantcode|commentcode|errorcode|contcode|cont_selcode] [terminal_code]";
		return 1;
	} else if (strcmp(azArg[0], "multiline") == 0) {
		linenoiseSetMultiLine(1);
		return 1;
	} else if (strcmp(azArg[0], "singleline") == 0) {
		linenoiseSetMultiLine(0);
		return 1;
	}
	return 0;
}